

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O3

NodeRecordMB4D * __thiscall
embree::sse2::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(NodeRecordMB4D *__return_storage_ptr__,
                 BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,BuildRecord *in,CachedAllocator alloc)

{
  ulong *puVar1;
  atomic<unsigned_long> *paVar2;
  pointer *pppTVar3;
  Split *pSVar4;
  int iVar5;
  uint uVar6;
  PrimRefVector *ppmVar7;
  ThreadLocal2 *pTVar8;
  iterator iVar9;
  Instance *pIVar10;
  PrimRefVector *ppmVar11;
  MemoryMonitorInterface *pMVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  vint *pvVar21;
  unsigned_long uVar22;
  unsigned_long uVar23;
  BBox1f BVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  char cVar27;
  long lVar28;
  PrimRefMB *pPVar29;
  size_t sVar30;
  undefined8 *puVar31;
  runtime_error *prVar32;
  long lVar33;
  PrimRefVector pmVar34;
  float *pfVar35;
  BBox1f *pBVar36;
  Split *pSVar37;
  bool bVar38;
  char *pcVar39;
  ulong uVar40;
  BuildRecord *in_00;
  PrimInfoMB *pPVar41;
  undefined8 uVar42;
  code *in_R8;
  PrimInfoMB *leftReduction;
  BBox1f BVar43;
  Split *pSVar44;
  code *pcVar45;
  ulong uVar46;
  ulong uVar47;
  uint *puVar48;
  bool bVar49;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar50;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar51;
  undefined8 uVar52;
  undefined8 uVar54;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar53;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar64;
  float fVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  task_group_context *in_stack_ffffffffffffe1d8;
  PrimRefVector local_1e20;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1e18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1e08;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1df8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1de8;
  SetMB *local_1dd8;
  BBox1f local_1dd0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1dc8;
  undefined8 *local_1db8;
  undefined8 uStack_1db0;
  PrimRefVector local_1da8;
  BBox1f time_range1;
  BBox1f time_range0;
  PrimRefVector lprims;
  PrimInfoMB right;
  PrimInfoMB left;
  anon_class_1_0_00000001 reduction;
  LBBox3fa lbbox_1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1bd8;
  BBox1f local_1bc8;
  size_t sStack_1bc0;
  size_t local_1bb8;
  BBox1f BStack_1bb0;
  BBox1f local_1ba8;
  BBox1f BStack_1ba0;
  size_t local_1b98;
  size_t sStack_1b90;
  undefined8 local_1b88;
  undefined8 uStack_1b80;
  PrimRefVector local_1b78;
  undefined8 local_1b68;
  undefined8 uStack_1b60;
  undefined8 local_1b58;
  undefined8 local_1b48;
  undefined8 uStack_1b40;
  undefined8 local_1b38;
  undefined8 uStack_1b30;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1b28;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1b18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1b08;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1af8;
  undefined8 local_1ae8;
  undefined8 uStack_1ae0;
  undefined8 local_1ad8;
  undefined8 uStack_1ad0;
  undefined8 local_1ac8;
  undefined8 uStack_1ac0;
  BBox1f local_1ab8;
  size_t sStack_1ab0;
  size_t local_1aa8;
  size_t sStack_1aa0;
  BBox1f local_1a98;
  PrimRefVector pmStack_1a90;
  PrimRefVector local_1a88;
  undefined8 local_1a78;
  undefined8 uStack_1a70;
  undefined8 local_1a68;
  undefined8 local_1a58;
  undefined8 uStack_1a50;
  undefined8 local_1a48;
  undefined8 uStack_1a40;
  vbool vSplitMask;
  anon_class_1_0_00000001 reduction2;
  undefined1 local_19d8 [16];
  anon_class_24_3_c5d13451 isLeft;
  vint vSplitPos;
  BuildRecordSplit current;
  LBBox3fa lbbox;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1788;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1778;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1768;
  BBox1f local_1758 [2];
  undefined1 local_1748 [16];
  BBox1f local_1738;
  float fStack_1730;
  float fStack_172c;
  PrimRefVector local_1728 [2];
  Split local_1718 [57];
  PrimRefVector *local_8c8 [16];
  ulong local_848;
  PrimRefVector local_840;
  PrimRefVector local_838 [63];
  long local_640;
  NodeRecordMB4D values [16];
  
  uVar46 = in->depth;
  if ((this->cfg).maxDepth < uVar46) {
    puVar31 = (undefined8 *)__cxa_allocate_exception(0x30);
    lbbox.bounds0.lower.field_0._0_8_ = &lbbox.bounds0.upper;
    std::__cxx11::string::_M_construct<char_const*>((string *)&lbbox,"depth limit reached","");
    *puVar31 = &PTR__rtcore_error_02184a18;
    *(undefined4 *)(puVar31 + 1) = 1;
    puVar31[2] = puVar31 + 4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar31 + 2),lbbox.bounds0.lower.field_0._0_8_,
               CONCAT71(lbbox.bounds0.lower.field_0._9_7_,lbbox.bounds0.lower.field_0._8_1_) +
               lbbox.bounds0.lower.field_0._0_8_);
    __cxa_throw(puVar31,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  local_1de8._0_8_ =
       *(undefined8 *)
        &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
         bounds0.lower.field_0;
  local_1de8._8_8_ =
       *(undefined8 *)
        ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                geomBounds.bounds0.lower.field_0 + 8);
  local_1dc8._0_8_ =
       *(undefined8 *)
        &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
         bounds0.upper.field_0;
  local_1dc8._8_8_ =
       *(undefined8 *)
        ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                geomBounds.bounds0.upper.field_0 + 8);
  local_1e18._0_8_ =
       *(undefined8 *)
        &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
         bounds1.lower.field_0;
  local_1e18._8_8_ =
       *(undefined8 *)
        ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                geomBounds.bounds1.lower.field_0 + 8);
  local_1df8._0_8_ =
       *(undefined8 *)
        &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
         bounds1.upper.field_0;
  local_1df8._8_8_ =
       *(undefined8 *)
        ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                geomBounds.bounds1.upper.field_0 + 8);
  local_1db8 = *(undefined8 **)
                &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                 centBounds.lower.field_0;
  uStack_1db0 = *(undefined8 *)
                 ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
                         .centBounds.lower.field_0 + 8);
  uVar52 = *(undefined8 *)
            &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
             upper.field_0;
  uVar54 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    centBounds.upper.field_0 + 8);
  uVar42 = (in->prims).super_PrimInfoMB.object_range._begin;
  BVar43 = (BBox1f)(in->prims).super_PrimInfoMB.object_range._end;
  values[0].lbounds.bounds0.lower.field_0._0_8_ = (in->prims).super_PrimInfoMB.max_time_range;
  values[0].lbounds.bounds0.lower.field_0._8_8_ = (in->prims).super_PrimInfoMB.time_range;
  values[0].ref.ptr = (in->prims).super_PrimInfoMB.num_time_segments;
  values[0]._8_8_ = (in->prims).super_PrimInfoMB.max_num_time_segments;
  pmVar34 = (in->prims).prims;
  local_1e08._8_8_ = local_1e08._0_8_;
  local_1e08._0_8_ = this;
  findFallback((Split *)&lbbox,this,&in->prims);
  local_1718[0].mapping.scale.field_0._8_8_ = lbbox.bounds1.upper.field_0._8_8_;
  local_1718[0].mapping.scale.field_0._0_8_ = lbbox.bounds1.upper.field_0._0_8_;
  local_1718[0].mapping.ofs.field_0._8_8_ = lbbox.bounds1.lower.field_0._8_8_;
  local_1718[0].mapping.ofs.field_0._0_8_ = lbbox.bounds1.lower.field_0._0_8_;
  local_1718[0].mapping.num = lbbox.bounds0.upper.field_0._0_8_;
  uVar25 = lbbox.bounds0.lower.field_0._0_8_;
  current.super_BuildRecord.depth = uVar46;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds0.lower.field_0._0_8_ = local_1de8._0_8_;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds0.lower.field_0._8_8_ = local_1de8._8_8_;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds0.upper.field_0._0_8_ = local_1dc8._0_8_;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds0.upper.field_0._8_8_ = local_1dc8._8_8_;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds1.lower.field_0._0_8_ = local_1e18._0_8_;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds1.lower.field_0._8_8_ = local_1e18._8_8_;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds1.upper.field_0._0_8_ = local_1df8._0_8_;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds1.upper.field_0._8_8_ = local_1df8._8_8_;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  centBounds.lower.field_0._0_8_ = local_1db8;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  centBounds.lower.field_0._8_8_ = uStack_1db0;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  centBounds.upper.field_0._0_8_ = uVar52;
  current.super_BuildRecord.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  centBounds.upper.field_0._8_8_ = uVar54;
  current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin._0_4_ = (float)uVar42;
  current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin._4_4_ = SUB84(uVar42,4);
  current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end._0_4_ = BVar43.lower;
  current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end._4_4_ = BVar43.upper;
  current.super_BuildRecord.prims.super_PrimInfoMB.num_time_segments = values[0].ref.ptr;
  current.super_BuildRecord.prims.super_PrimInfoMB.max_num_time_segments = values[0]._8_8_;
  current.super_BuildRecord.prims.super_PrimInfoMB.max_time_range.lower =
       (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
  current.super_BuildRecord.prims.super_PrimInfoMB.max_time_range.upper =
       (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
  current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower =
       (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper =
       (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
  BVar24 = current.super_BuildRecord.prims.super_PrimInfoMB.time_range;
  current.super_BuildRecord.prims.prims = pmVar34;
  current.split.sah = (float)lbbox.bounds0.lower.field_0._0_4_;
  current.split.dim = lbbox.bounds0.lower.field_0._4_4_;
  current.split.mapping.num = lbbox.bounds0.upper.field_0._0_8_;
  current.split.mapping.ofs.field_0._0_8_ = lbbox.bounds1.lower.field_0._0_8_;
  current.split.mapping.ofs.field_0._8_8_ = lbbox.bounds1.lower.field_0._8_8_;
  current.split.mapping.scale.field_0._0_8_ = lbbox.bounds1.upper.field_0._0_8_;
  current.split.mapping.scale.field_0._8_8_ = lbbox.bounds1.upper.field_0._8_8_;
  uVar47 = (long)BVar43 - uVar42;
  if (uVar47 == 0 || uVar46 != 1) {
    bVar38 = false;
  }
  else {
    current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower =
         (float)values[0].lbounds.bounds0.lower.field_0._8_8_;
    current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper =
         (float)((ulong)values[0].lbounds.bounds0.lower.field_0._8_8_ >> 0x20);
    lVar33 = (long)BVar43 - uVar42;
    if ((ulong)BVar43 < (ulong)uVar42 || lVar33 == 0) {
      auVar56._0_12_ = ZEXT812(0x7f800000);
      auVar56._12_4_ = 0;
      fVar65 = -INFINITY;
    }
    else {
      pfVar35 = &pmVar34->items[uVar42].time_range.upper;
      fVar65 = -INFINITY;
      auVar56._0_12_ = ZEXT812(0x7f800000);
      auVar56._12_4_ = 0;
      do {
        if (((BBox1f *)(pfVar35 + -1))->lower <= auVar56._0_4_) {
          auVar56._0_4_ = ((BBox1f *)(pfVar35 + -1))->lower;
        }
        fVar61 = *pfVar35;
        if (*pfVar35 <= fVar65) {
          fVar61 = fVar65;
        }
        fVar65 = fVar61;
        pfVar35 = pfVar35 + 0x14;
        lVar33 = lVar33 + -1;
      } while (lVar33 != 0);
    }
    bVar38 = fVar65 < current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper ||
             current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower < auVar56._0_4_;
  }
  local_1dd0 = BVar43;
  current.super_BuildRecord.prims.super_PrimInfoMB.time_range = BVar24;
  if (((uVar47 <= *(ulong *)(local_1e08._0_8_ + 0x20)) &&
      (current.split.data = (uint)((uint7)lbbox.bounds0.lower.field_0._9_7_ >> 0x18),
      current.split.data < 2)) && (!bVar38)) {
    local_1b28._0_8_ = uVar47 * 0x10;
    pTVar8 = (alloc.talloc1)->parent;
    if (alloc.alloc != (pTVar8->alloc)._M_b._M_p) {
      values[0]._8_1_ = 1;
      values[0].ref.ptr = (size_t)pTVar8;
      MutexSys::lock(&pTVar8->mutex);
      if ((pTVar8->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar2 = &((pTVar8->alloc)._M_b._M_p)->bytesUsed;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar8->alloc1).bytesUsed + (pTVar8->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar8->alloc)._M_b._M_p)->bytesFree;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar8->alloc0).end + (pTVar8->alloc1).end) -
             ((pTVar8->alloc0).cur + (pTVar8->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar8->alloc)._M_b._M_p)->bytesWasted;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar8->alloc1).bytesWasted + (pTVar8->alloc0).bytesWasted;
        UNLOCK();
      }
      (pTVar8->alloc0).bytesUsed = 0;
      (pTVar8->alloc0).bytesWasted = 0;
      (pTVar8->alloc0).end = 0;
      (pTVar8->alloc0).allocBlockSize = 0;
      (pTVar8->alloc0).ptr = (char *)0x0;
      (pTVar8->alloc0).cur = 0;
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar8->alloc1).bytesUsed = 0;
        (pTVar8->alloc1).bytesWasted = 0;
        (pTVar8->alloc1).end = 0;
        (pTVar8->alloc1).allocBlockSize = 0;
        (pTVar8->alloc1).ptr = (char *)0x0;
        (pTVar8->alloc1).cur = 0;
      }
      else {
        (pTVar8->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar8->alloc1).ptr = (char *)0x0;
        (pTVar8->alloc1).cur = 0;
        (pTVar8->alloc1).end = 0;
        (pTVar8->alloc1).allocBlockSize = 0;
        (pTVar8->alloc1).bytesUsed = 0;
        (pTVar8->alloc1).bytesWasted = 0;
        (pTVar8->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar8->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      lbbox.bounds0.lower.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
      lbbox.bounds0.lower.field_0._8_1_ = 1;
      lbbox_1.bounds0.lower.field_0._0_8_ = pTVar8;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar9._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar9._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar9,(ThreadLocal2 **)&lbbox_1);
      }
      else {
        *iVar9._M_current = pTVar8;
        pppTVar3 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar3 = *pppTVar3 + 1;
      }
      MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      if (values[0]._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)values[0].ref.ptr);
      }
    }
    uVar52 = local_1b28._0_8_;
    (alloc.talloc1)->bytesUsed = (alloc.talloc1)->bytesUsed + local_1b28._0_8_;
    sVar30 = (alloc.talloc1)->cur;
    uVar46 = (ulong)(-(int)sVar30 & 0xf);
    uVar40 = sVar30 + local_1b28._0_8_ + uVar46;
    (alloc.talloc1)->cur = uVar40;
    if ((alloc.talloc1)->end < uVar40) {
      (alloc.talloc1)->cur = sVar30;
      uVar46 = (alloc.talloc1)->allocBlockSize;
      if ((ulong)(local_1b28._0_8_ * 4) < uVar46 || local_1b28._0_8_ * 4 - uVar46 == 0) {
        local_1de8.m128[0] = (float)uVar42;
        local_1de8.m128[1] = SUB84(uVar42,4);
        lbbox.bounds0.lower.field_0._0_8_ = uVar46;
        pcVar39 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&lbbox);
        (alloc.talloc1)->ptr = pcVar39;
        sVar30 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar30;
        (alloc.talloc1)->end = lbbox.bounds0.lower.field_0._0_8_;
        (alloc.talloc1)->cur = uVar52;
        if ((ulong)lbbox.bounds0.lower.field_0._0_8_ < (ulong)uVar52) {
          (alloc.talloc1)->cur = 0;
          lbbox.bounds0.lower.field_0._0_8_ = (alloc.talloc1)->allocBlockSize;
          pcVar39 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&lbbox);
          (alloc.talloc1)->ptr = pcVar39;
          sVar30 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
          (alloc.talloc1)->bytesWasted = sVar30;
          (alloc.talloc1)->end = lbbox.bounds0.lower.field_0._0_8_;
          (alloc.talloc1)->cur = uVar52;
          if ((ulong)lbbox.bounds0.lower.field_0._0_8_ < (ulong)uVar52) {
            (alloc.talloc1)->cur = 0;
            pcVar39 = (char *)0x0;
            uVar42 = local_1de8._0_8_;
            goto LAB_00c76f57;
          }
        }
        (alloc.talloc1)->bytesWasted = sVar30;
        uVar42 = local_1de8._0_8_;
      }
      else {
        pcVar39 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_1b28);
      }
    }
    else {
      (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar46;
      pcVar39 = (alloc.talloc1)->ptr + (uVar40 - local_1b28._0_8_);
    }
LAB_00c76f57:
    uVar46 = 7;
    if (uVar47 < 7) {
      uVar46 = uVar47;
    }
    local_1db8 = (undefined8 *)(uVar46 | (ulong)pcVar39 | 8);
    local_1de8 = _DAT_01f7a9f0;
    local_1dc8 = _DAT_01f7aa00;
    local_1e18 = _DAT_01f7aa00;
    local_1df8 = _DAT_01f7a9f0;
    if (local_1dd0 != (BBox1f)uVar42) {
      puVar48 = (uint *)(pcVar39 + 8);
      lVar33 = uVar42 * 0x50 + 0xc;
      uVar42 = local_1e08._0_8_;
      do {
        values[0].ref.ptr._0_4_ = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower;
        values[0].ref.ptr._4_4_ = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
        uVar6 = *(uint *)((long)&((current.super_BuildRecord.prims.prims)->items->lbounds).bounds0.
                                 lower.field_0 + lVar33);
        pIVar10 = *(Instance **)
                   (*(long *)(*(long *)(*(long *)(uVar42 + 0x70) + 0x68) + 0x1e8) + (ulong)uVar6 * 8
                   );
        *(Instance **)(puVar48 + -2) = pIVar10;
        *puVar48 = uVar6;
        Instance::nonlinearBounds
                  (&lbbox,pIVar10,(BBox1f *)values,&(pIVar10->super_Geometry).time_range,
                   (pIVar10->super_Geometry).fnumTimeSegments);
        auVar17[8] = lbbox.bounds0.lower.field_0._8_1_;
        auVar17._0_8_ = lbbox.bounds0.lower.field_0._0_8_;
        auVar17._9_7_ = lbbox.bounds0.lower.field_0._9_7_;
        local_1df8.m128 = (__m128)minps(local_1df8.m128,auVar17);
        auVar18._8_8_ = lbbox.bounds0.upper.field_0._8_8_;
        auVar18._0_8_ = lbbox.bounds0.upper.field_0._0_8_;
        local_1e18.m128 = (__m128)maxps(local_1e18.m128,auVar18);
        auVar19._8_8_ = lbbox.bounds1.lower.field_0._8_8_;
        auVar19._0_8_ = lbbox.bounds1.lower.field_0._0_8_;
        local_1de8.m128 = (__m128)minps(local_1de8.m128,auVar19);
        auVar20._8_8_ = lbbox.bounds1.upper.field_0._8_8_;
        auVar20._0_8_ = lbbox.bounds1.upper.field_0._0_8_;
        local_1dc8.m128 = (__m128)maxps(local_1dc8.m128,auVar20);
        puVar48 = puVar48 + 4;
        lVar33 = lVar33 + 0x50;
        uVar47 = uVar47 - 1;
      } while (uVar47 != 0);
    }
    (__return_storage_ptr__->ref).ptr = (size_t)local_1db8;
    (__return_storage_ptr__->lbounds).bounds0.lower.field_0 = local_1df8;
    (__return_storage_ptr__->lbounds).bounds0.upper.field_0 = local_1e18;
    (__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1de8;
    (__return_storage_ptr__->lbounds).bounds1.upper.field_0 = local_1dc8;
    __return_storage_ptr__->dt = current.super_BuildRecord.prims.super_PrimInfoMB.time_range;
    return __return_storage_ptr__;
  }
  lVar33 = 0xbc;
  do {
    *(undefined8 *)((long)&current.split.mapping.scale.field_0 + lVar33 + 4) = 0xffffffff7f800000;
    *(undefined8 *)((long)&current.split.mapping.scale.field_0 + lVar33 + 0xc) = 0;
    lVar33 = lVar33 + 0xf0;
  } while (lVar33 != 0xfbc);
  local_848 = 1;
  local_640 = 1;
  lbbox.bounds0.lower.field_0._0_8_ = uVar46;
  uVar26 = lbbox.bounds0.lower.field_0._0_8_;
  lbbox.bounds0.upper.field_0._0_8_ = local_1de8._0_8_;
  lbbox.bounds0.upper.field_0._8_8_ = local_1de8._8_8_;
  lbbox.bounds1.lower.field_0._0_8_ = local_1dc8._0_8_;
  lbbox.bounds1.lower.field_0._8_8_ = local_1dc8._8_8_;
  lbbox.bounds1.upper.field_0._0_8_ = local_1e18._0_8_;
  lbbox.bounds1.upper.field_0._8_8_ = local_1e18._8_8_;
  local_1788._0_8_ = local_1df8._0_8_;
  local_1788._8_8_ = local_1df8._8_8_;
  local_1778._0_8_ = local_1db8;
  local_1778._8_8_ = uStack_1db0;
  local_1768._0_8_ = uVar52;
  local_1768._8_8_ = uVar54;
  local_1748._8_8_ = values[0]._8_8_;
  local_1748._0_8_ = values[0].ref.ptr;
  local_1758[0] = (BBox1f)uVar42;
  local_1758[1] = BVar43;
  local_1738.lower = (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
  local_1738.upper = (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
  fStack_1730 = (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  fStack_172c = (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
  local_1728[0] = pmVar34;
  lbbox.bounds0.lower.field_0._0_4_ = (undefined4)uVar25;
  lbbox.bounds0.lower.field_0._4_4_ = SUB84(uVar25,4);
  local_1718[0].sah = (float)lbbox.bounds0.lower.field_0._0_4_;
  local_1718[0].dim = lbbox.bounds0.lower.field_0._4_4_;
  local_840 = pmVar34;
  local_838[0] = (PrimRefVector)0x2;
  local_8c8[0] = &local_840;
  local_1df8._0_8_ = &local_1b68;
  local_1db8 = &local_1a78;
  puVar1 = (ulong *)(local_1e08._0_8_ + 0x48);
  local_1dc8._8_8_ = 0x7f8000007f800000;
  local_1dc8._0_8_ = 0x7f8000007f800000;
  local_1de8._8_8_ = 0xff800000ff800000;
  local_1de8._0_8_ = 0xff800000ff800000;
  BVar43.lower = 0.0;
  BVar43.upper = 0.0;
  lbbox.bounds0.lower.field_0._0_8_ = uVar26;
  do {
    leftReduction = &left;
    if (local_848 == 0) goto LAB_00c76471;
    uVar46 = 0xffffffffffffffff;
    pBVar36 = local_1758;
    pPVar41 = (PrimInfoMB *)0x0;
    uVar47 = 0;
    do {
      in_R8 = (code *)((long)pBVar36[1] - (long)*pBVar36);
      if (((*(PrimInfoMB **)(local_1e08._0_8_ + 0x20) < in_R8) || (1 < (uint)pBVar36[9].upper)) ||
         (bVar38)) {
        if (pPVar41 < in_R8) {
          uVar46 = uVar47;
          pPVar41 = (PrimInfoMB *)in_R8;
        }
        bVar38 = false;
      }
      uVar47 = uVar47 + 1;
      pBVar36 = pBVar36 + 0x1e;
    } while (local_848 != uVar47);
    if (uVar46 == 0xffffffffffffffff) goto LAB_00c76427;
    lVar33 = uVar46 * 0xf0;
    local_1e18._0_8_ = (long)&lbbox + lVar33;
    lbbox_1.bounds0.lower.field_0._0_8_ = current.super_BuildRecord.depth + 1;
    local_1b68 = 0xffffffff7f800000;
    uStack_1b60 = 0;
    local_1b28._0_8_ = lbbox_1.bounds0.lower.field_0._0_8_;
    local_1a78 = 0xffffffff7f800000;
    uStack_1a70 = 0;
    pSVar4 = (Split *)((long)local_1718 + lVar33);
    iVar5 = *(int *)((long)local_1718 + lVar33 + 0xc);
    local_1dd0 = BVar43;
    if (iVar5 == 0) {
      local_1ba8 = local_1758[uVar46 * 0x1e];
      sVar30 = *(size_t *)(local_1748 + lVar33 + -8);
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           0x7f8000007f800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           0x7f8000007f800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0xff800000ff800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._8_8_ =
           0xff800000ff800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._0_8_ =
           0x7f8000007f800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._8_8_ =
           0x7f8000007f800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._0_8_ =
           0xff800000ff800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._8_8_ =
           0xff800000ff800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ =
           0x7f8000007f800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
           0x7f8000007f800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ =
           0xff800000ff800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ =
           0xff800000ff800000;
      left.max_time_range.lower = 0.0;
      left.num_time_segments = 0;
      left.max_num_time_segments = 0;
      left.object_range._begin = 0;
      left.object_range._end = 0;
      left.max_time_range.upper = 1.0;
      left.time_range.lower = 1.0;
      left.time_range.upper = 0.0;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._8_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._8_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ =
           0xff800000ff800000;
      right.max_time_range.lower = 0.0;
      right.num_time_segments = 0;
      right.max_num_time_segments = 0;
      right.object_range._begin = 0;
      right.object_range._end = 0;
      right.max_time_range.upper = 1.0;
      right.time_range.lower = 1.0;
      right.time_range.upper = 0.0;
      vSplitPos.field_0.i[1] = *(undefined4 *)((long)local_1718 + lVar33 + 8);
      vSplitPos.field_0.i[0] = vSplitPos.field_0.i[1];
      vSplitPos.field_0.i[3] = vSplitPos.field_0.i[1];
      vSplitPos.field_0.i[2] = vSplitPos.field_0.i[1];
      lVar28 = (long)(1 << (*(byte *)((long)local_1718 + lVar33 + 4) & 0x1f)) * 0x10;
      vSplitMask.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar28);
      vSplitMask.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar28 + 8);
      isLeft.split = pSVar4;
      isLeft.vSplitPos = &vSplitPos;
      isLeft.vSplitMask = &vSplitMask;
      BStack_1ba0 = (BBox1f)parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                                      (local_1728[uVar46 * 0x1e]->items,(size_t)local_1ba8,sVar30,
                                       (EmptyTy *)local_19d8,leftReduction,&right,&isLeft,&reduction
                                       ,&reduction2,0x80,0xc00);
      local_1b78 = local_1728[uVar46 * 0x1e];
      pmVar34 = local_1728[uVar46 * 0x1e + -1];
      local_1bd8._8_8_ =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
           _8_8_;
      local_1bd8._0_8_ =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
           _0_8_;
      lbbox_1.bounds0.upper.field_0._0_8_ =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      lbbox_1.bounds0.upper.field_0._8_8_ =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _8_8_;
      lbbox_1.bounds1.lower.field_0._0_8_ =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
           _0_8_;
      lbbox_1.bounds1.lower.field_0._8_8_ =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
           _8_8_;
      lbbox_1.bounds1.upper.field_0._0_8_ =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
           _0_8_;
      lbbox_1.bounds1.upper.field_0._8_8_ =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
           _8_8_;
      local_1bc8.lower =
           (float)left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_4_
      ;
      local_1bc8.upper =
           (float)left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._4_4_
      ;
      sStack_1bc0 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.
                    _8_8_;
      local_1bb8 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.
                   _0_8_;
      BStack_1bb0.lower =
           (float)left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_4_
      ;
      BStack_1bb0.upper =
           (float)left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.
                  _12_4_;
      local_1b88 = CONCAT44(left.max_time_range.upper,left.max_time_range.lower);
      local_1b98 = left.num_time_segments;
      sStack_1b90 = left.max_num_time_segments;
      fVar61 = SUB84(pmVar34,0);
      fVar65 = fVar61;
      if (fVar61 <= left.time_range.lower) {
        fVar65 = left.time_range.lower;
      }
      fVar70 = (float)((ulong)pmVar34 >> 0x20);
      fVar64 = left.time_range.upper;
      if (fVar70 <= left.time_range.upper) {
        fVar64 = fVar70;
      }
      uStack_1b80 = CONCAT44(fVar64,fVar65);
      local_1b18._8_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _8_8_;
      local_1b18._0_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      local_1b08._8_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
           _8_8_;
      local_1b08._0_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
           _0_8_;
      local_1af8._8_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
           _8_8_;
      local_1af8._0_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
           _0_8_;
      local_1ae8 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                   field_0._0_8_;
      uStack_1ae0 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                    field_0._8_8_;
      local_1ad8 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.
                   _0_8_;
      uStack_1ad0 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.
                    _8_8_;
      local_1ac8 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.
                   _0_8_;
      uStack_1ac0 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.
                    _8_8_;
      local_1a98.upper = right.max_time_range.upper;
      local_1a98.lower = right.max_time_range.lower;
      local_1aa8 = right.num_time_segments;
      sStack_1aa0 = right.max_num_time_segments;
      if (fVar61 <= right.time_range.lower) {
        pmVar34 = (PrimRefVector)(ulong)(uint)right.time_range.lower;
      }
      fVar65 = right.time_range.upper;
      if (fVar70 <= right.time_range.upper) {
        fVar65 = fVar70;
      }
      pmStack_1a90 = (PrimRefVector)CONCAT44(fVar65,(int)pmVar34);
      in_R8 = (code *)leftReduction;
      local_1ab8 = BStack_1ba0;
      sStack_1ab0 = sVar30;
      local_1a88 = local_1b78;
LAB_00c756ff:
      local_1e20 = (PrimRefVector)0x0;
      bVar49 = false;
    }
    else {
      local_1dd8 = (SetMB *)((long)&lbbox + lVar33 + 0x10);
      if (iVar5 != 2) {
        if (iVar5 == 1) {
          SetMB::deterministic_order(local_1dd8);
          splitFallback((BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
                         *)local_1e08._0_8_,local_1dd8,(SetMB *)&lbbox_1.bounds0.upper,
                        (SetMB *)&local_1b18.field_1);
        }
        else if (iVar5 == 3) {
          SetMB::deterministic_order(local_1dd8);
          splitByGeometry((BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
                           *)local_1e08._0_8_,local_1dd8,(SetMB *)&lbbox_1.bounds0.upper,
                          (SetMB *)&local_1b18.field_1);
        }
        goto LAB_00c756ff;
      }
      time_range1.lower = *(float *)((long)local_1718 + lVar33 + 8);
      time_range0.lower = *(float *)(local_1728 + uVar46 * 0x1e + -1);
      time_range1.upper = *(float *)((long)local_1728 + lVar33 + -4);
      local_1da8 = local_1728[uVar46 * 0x1e];
      time_range0.upper = time_range1.lower;
      local_1b78 = (PrimRefVector)operator_new(0x28);
      pMVar12 = (MemoryMonitorInterface *)*puVar1;
      pSVar37 = *(Split **)(local_1748 + lVar33 + -8);
      (local_1b78->alloc).device = pMVar12;
      (local_1b78->alloc).hugepages = false;
      local_1b78->size_active = 0;
      local_1b78->size_alloced = 0;
      local_1b78->items = (PrimRefMB *)0x0;
      sVar30 = (long)pSVar37 - (long)local_1758[uVar46 * 0x1e];
      pSVar44 = pSVar37;
      if (sVar30 != 0) {
        uVar47 = sVar30 * 0x50;
        (**pMVar12->_vptr_MemoryMonitorInterface)(pMVar12,uVar47,0);
        if (uVar47 < 0x1c00000) {
          pPVar29 = (PrimRefMB *)alignedMalloc(uVar47,0x10);
        }
        else {
          pPVar29 = (PrimRefMB *)os_malloc(uVar47,&(local_1b78->alloc).hugepages);
        }
        local_1b78->items = pPVar29;
        local_1b78->size_active = sVar30;
        local_1b78->size_alloced = sVar30;
        pSVar37 = *(Split **)(local_1e18._0_8_ + 0x70);
        pSVar44 = *(Split **)(local_1e18._0_8_ + 0x78);
      }
      pvVar21 = isLeft.vSplitPos;
      vSplitMask.field_0._0_8_ = local_1da8;
      vSplitMask.field_0._8_8_ = &time_range0;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._8_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._8_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ =
           0xff800000ff800000;
      right.max_time_range.lower = 0.0;
      right.num_time_segments = 0;
      right.max_num_time_segments = 0;
      right.object_range._begin = 0;
      right.object_range._end = 0;
      right.max_time_range.upper = 1.0;
      right.time_range.lower = 1.0;
      right.time_range.upper = 0.0;
      local_1e20 = local_1b78;
      if ((ulong)((long)pSVar44 - (long)pSVar37) < 0xc00) {
        isLeft.split = pSVar37;
        isLeft.vSplitPos = (vint *)pSVar44;
        ::anon_func::anon_class_40_5_808acc65::operator()
                  (&left,(anon_class_40_5_808acc65 *)&vSplitMask,(range<unsigned_long> *)&isLeft);
      }
      else {
        isLeft.vSplitPos._6_2_ = SUB82(pvVar21,6);
        isLeft.vSplitPos._0_6_ = CONCAT15(4,CONCAT14(1,isLeft.vSplitPos._0_4_));
        tbb::detail::r1::initialize((task_group_context *)&isLeft);
        in_R8 = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        _reduction = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        vSplitPos.field_0.v[0] = (longlong)pSVar44;
        vSplitPos.field_0.v[1] = (longlong)pSVar37;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  (&left,(d1 *)&vSplitPos,(blocked_range<unsigned_long> *)&right,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                   (anon_class_16_2_ed117de8_conflict29 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&isLeft,in_stack_ffffffffffffe1d8);
        cVar27 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
        if (cVar27 != '\0') {
          prVar32 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar32,"task cancelled");
          __cxa_throw(prVar32,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::r1::destroy((task_group_context *)&isLeft);
      }
      lVar28 = *(long *)(local_1e18._0_8_ + 0x70);
      pcVar45 = *(code **)(local_1e18._0_8_ + 0x78);
      uVar47 = (long)pcVar45 - lVar28;
      if (left.object_range._end - left.object_range._begin != uVar47) {
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
             = &time_range0;
        in_R8 = (code *)&right;
        left.object_range._end =
             parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                       (local_1b78->items,0,uVar47,0x400,(anon_class_8_1_41ce32a5 *)in_R8);
        lVar28 = *(long *)(local_1e18._0_8_ + 0x70);
        pcVar45 = *(code **)(local_1e18._0_8_ + 0x78);
        uVar47 = (long)pcVar45 - lVar28;
      }
      uVar42 = vSplitPos.field_0.v[1];
      BStack_1ba0 = (BBox1f)left.object_range._end;
      local_1b98 = left.num_time_segments;
      sStack_1b90 = left.max_num_time_segments;
      lbbox_1.bounds0.upper.field_0._0_8_ =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      lbbox_1.bounds0.upper.field_0._8_8_ =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _8_8_;
      lbbox_1.bounds1.lower.field_0._0_8_ =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
           _0_8_;
      lbbox_1.bounds1.lower.field_0._8_8_ =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
           _8_8_;
      lbbox_1.bounds1.upper.field_0._0_8_ =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
           _0_8_;
      lbbox_1.bounds1.upper.field_0._8_8_ =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
           _8_8_;
      local_1bd8._8_8_ =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
           _8_8_;
      local_1bd8._0_8_ =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
           _0_8_;
      local_1bc8.lower =
           (float)left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_4_
      ;
      local_1bc8.upper =
           (float)left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._4_4_
      ;
      sStack_1bc0 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.
                    _8_8_;
      local_1bb8 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.
                   _0_8_;
      BStack_1bb0.lower =
           (float)left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_4_
      ;
      BStack_1bb0.upper =
           (float)left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.
                  _12_4_;
      local_1ba8.lower = (float)(undefined4)left.object_range._begin;
      local_1ba8.upper = (float)left.object_range._begin._4_4_;
      local_1b88 = CONCAT44(left.max_time_range.upper,left.max_time_range.lower);
      uStack_1b80 = CONCAT44(~-(uint)(left.time_range.upper < time_range0.upper) &
                             (uint)time_range0.upper,
                             ~-(uint)(left.time_range.lower < time_range0.lower) &
                             (uint)left.time_range.lower) |
                    CONCAT44((uint)left.time_range.upper &
                             -(uint)(left.time_range.upper < time_range0.upper),
                             (uint)time_range0.lower &
                             -(uint)(left.time_range.lower < time_range0.lower));
      _reduction2 = local_1da8;
      isLeft.split = (Split *)0x7f8000007f800000;
      isLeft.vSplitPos = (vint *)0x7f8000007f800000;
      isLeft.vSplitMask = (vbool *)0xff800000ff800000;
      if (uVar47 < 0xc00) {
        vSplitPos.field_0.v[0] = lVar28;
        vSplitPos.field_0.v[1] = (longlong)pcVar45;
        ::anon_func::anon_class_24_3_35f68c7c::operator()
                  (&right,(anon_class_24_3_35f68c7c *)&reduction2,(range<unsigned_long> *)&vSplitPos
                  );
      }
      else {
        vSplitPos.field_0.v[1]._4_1_ = 1;
        vSplitPos.field_0.v[1]._6_2_ = SUB82(uVar42,6);
        vSplitPos.field_0.v[1]._5_1_ = 4;
        tbb::detail::r1::initialize((task_group_context *)&vSplitPos);
        in_R8 = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        local_19d8._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        local_19d8._8_8_ = &reduction2;
        _reduction = pcVar45;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  (&right,(d1 *)&reduction,(blocked_range<unsigned_long> *)&isLeft,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_19d8,
                   (anon_class_16_2_ed117de8_conflict30 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&vSplitPos,in_stack_ffffffffffffe1d8);
        cVar27 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos);
        if (cVar27 != '\0') {
          prVar32 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar32,"task cancelled");
          __cxa_throw(prVar32,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::r1::destroy((task_group_context *)&vSplitPos);
      }
      lVar28 = right.object_range._end - right.object_range._begin;
      right.object_range._begin = *(unsigned_long *)(local_1e18._0_8_ + 0x70);
      right.object_range._end = lVar28 + right.object_range._begin;
      if (lVar28 != *(unsigned_long *)(local_1e18._0_8_ + 0x78) - right.object_range._begin) {
        isLeft.split = (Split *)&time_range1;
        in_R8 = (code *)&isLeft;
        right.object_range._end =
             parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                       (local_1da8->items,right.object_range._begin,
                        *(unsigned_long *)(local_1e18._0_8_ + 0x78),0x400,
                        (anon_class_8_1_41ce32a6 *)in_R8);
      }
      local_1ae8 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                   field_0._0_8_;
      uStack_1ae0 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                    field_0._8_8_;
      local_1ac8 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.
                   _0_8_;
      uStack_1ac0 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.
                    _8_8_;
      local_1aa8 = right.num_time_segments;
      sStack_1aa0 = right.max_num_time_segments;
      local_1b18._8_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _8_8_;
      local_1b18._0_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      local_1b08._8_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
           _8_8_;
      local_1b08._0_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
           _0_8_;
      local_1af8._8_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
           _8_8_;
      local_1af8._0_8_ =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
           _0_8_;
      local_1ad8 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.
                   _0_8_;
      uStack_1ad0 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.
                    _8_8_;
      local_1a98.upper = right.max_time_range.upper;
      local_1a98.lower = right.max_time_range.lower;
      pmStack_1a90 = (PrimRefVector)
                     (CONCAT44(~-(uint)(right.time_range.upper < time_range1.upper) &
                               (uint)time_range1.upper,
                               ~-(uint)(right.time_range.lower < time_range1.lower) &
                               (uint)right.time_range.lower) |
                     CONCAT44((uint)right.time_range.upper &
                              -(uint)(right.time_range.upper < time_range1.upper),
                              (uint)time_range1.lower &
                              -(uint)(right.time_range.lower < time_range1.lower)));
      local_1a88 = local_1da8;
      bVar49 = local_1e20 != (PrimRefVector)0x0;
      local_1ab8 = (BBox1f)right.object_range._begin;
      sStack_1ab0 = right.object_range._end;
    }
    uVar42 = local_1e08._0_8_;
    findFallback((Split *)&left,
                 (BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
                  *)local_1e08._0_8_,(SetMB *)&lbbox_1.bounds0.upper);
    *(undefined8 *)local_1df8._0_8_ =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
    *(undefined8 *)(local_1df8._0_8_ + 8) =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_;
    local_1b58 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                 field_0._0_8_;
    local_1b48 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                 field_0._0_8_;
    uStack_1b40 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                  field_0._8_8_;
    local_1b38 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                 field_0._0_8_;
    uStack_1b30 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                  field_0._8_8_;
    findFallback((Split *)&left,
                 (BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
                  *)uVar42,(SetMB *)&local_1b18.field_1);
    lVar28 = local_640;
    *local_1db8 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                  field_0._0_8_;
    local_1db8[1] =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_;
    local_1a68 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                 field_0._0_8_;
    local_1a58 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                 field_0._0_8_;
    uStack_1a50 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                  field_0._8_8_;
    local_1a48 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                 field_0._0_8_;
    uStack_1a40 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                  field_0._8_8_;
    local_1e20 = (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                  *)0x0;
    ppmVar7 = local_8c8[uVar46];
    if (local_1b78 == *ppmVar7) {
      ppmVar7[1] = (PrimRefVector)((long)&(ppmVar7[1]->alloc).device + 1);
      pmVar34 = local_1b78;
    }
    else {
      local_640 = local_640 + 1;
      local_838[lVar28 * 2 + -1] = local_1b78;
      local_838[lVar28 * 2] = (PrimRefVector)0x1;
      local_8c8[uVar46] = local_838 + lVar28 * 2 + -1;
      pmVar34 = *ppmVar7;
    }
    lVar28 = local_640;
    if (local_1a88 == pmVar34) {
      local_8c8[local_848] = ppmVar7;
      pmVar34 = ppmVar7[1];
      ppmVar7[1] = (PrimRefVector)((long)&(pmVar34->alloc).device + 1);
    }
    else {
      local_640 = local_640 + 1;
      local_838[lVar28 * 2 + -1] = local_1a88;
      local_838[lVar28 * 2] = (PrimRefVector)0x1;
      local_8c8[local_848] = local_838 + lVar28 * 2 + -1;
      pmVar34 = (PrimRefVector)((long)&ppmVar7[1][-1].items + 7);
    }
    ppmVar7[1] = pmVar34;
    if (pmVar34 == (PrimRefVector)0x0) {
      pmVar34 = *ppmVar7;
      if (pmVar34 != (PrimRefVector)0x0) {
        sVar30 = pmVar34->size_alloced;
        pPVar29 = pmVar34->items;
        if (pPVar29 != (PrimRefMB *)0x0) {
          if (sVar30 * 0x50 < 0x1c00000) {
            alignedFree(pPVar29);
          }
          else {
            os_free(pPVar29,sVar30 * 0x50,(pmVar34->alloc).hugepages);
          }
        }
        if (sVar30 != 0) {
          pMVar12 = (pmVar34->alloc).device;
          (**pMVar12->_vptr_MemoryMonitorInterface)(pMVar12,sVar30 * -0x50,1);
        }
        pmVar34->size_active = 0;
        pmVar34->size_alloced = 0;
        pmVar34->items = (PrimRefMB *)0x0;
      }
      operator_delete(pmVar34);
    }
    *(undefined8 *)local_1e18._0_8_ = lbbox_1.bounds0.lower.field_0._0_8_;
    *(undefined8 *)(local_1e18._0_8_ + 0x10) = lbbox_1.bounds0.upper.field_0._0_8_;
    *(undefined8 *)(local_1e18._0_8_ + 0x18) = lbbox_1.bounds0.upper.field_0._8_8_;
    *(undefined8 *)(local_1e18._0_8_ + 0x20) = lbbox_1.bounds1.lower.field_0._0_8_;
    *(undefined8 *)(local_1e18._0_8_ + 0x28) = lbbox_1.bounds1.lower.field_0._8_8_;
    *(undefined8 *)(local_1e18._0_8_ + 0x30) = lbbox_1.bounds1.upper.field_0._0_8_;
    *(undefined8 *)(local_1e18._0_8_ + 0x38) = lbbox_1.bounds1.upper.field_0._8_8_;
    *(undefined8 *)(local_1e18._0_8_ + 0x40) = local_1bd8._0_8_;
    *(undefined8 *)(local_1e18._0_8_ + 0x48) = local_1bd8._8_8_;
    *(BBox1f *)(local_1e18._0_8_ + 0x50) = local_1bc8;
    *(size_t *)(local_1e18._0_8_ + 0x58) = sStack_1bc0;
    *(size_t *)(local_1e18._0_8_ + 0x60) = local_1bb8;
    *(BBox1f *)(local_1e18._0_8_ + 0x68) = BStack_1bb0;
    *(BBox1f *)(local_1e18._0_8_ + 0x70) = local_1ba8;
    *(BBox1f *)(local_1e18._0_8_ + 0x78) = BStack_1ba0;
    *(size_t *)(local_1e18._0_8_ + 0x80) = local_1b98;
    *(size_t *)(local_1e18._0_8_ + 0x88) = sStack_1b90;
    *(undefined8 *)(local_1e18._0_8_ + 0x90) = local_1b88;
    *(ulong *)(local_1e18._0_8_ + 0x98) = uStack_1b80;
    *(PrimRefVector *)(local_1e18._0_8_ + 0xa0) = local_1b78;
    uVar42 = *(undefined8 *)local_1df8._0_8_;
    uVar52 = *(undefined8 *)(local_1df8._0_8_ + 8);
    pSVar4->sah = (float)(int)uVar42;
    pSVar4->dim = (int)((ulong)uVar42 >> 0x20);
    *(undefined8 *)((long)local_1718 + lVar33 + 8) = uVar52;
    uVar46 = local_848;
    *(undefined8 *)(local_1e18._0_8_ + 0xc0) = local_1b58;
    *(undefined8 *)(local_1e18._0_8_ + 0xd0) = local_1b48;
    *(undefined8 *)(local_1e18._0_8_ + 0xd8) = uStack_1b40;
    *(undefined8 *)(local_1e18._0_8_ + 0xe0) = local_1b38;
    *(undefined8 *)(local_1e18._0_8_ + 0xe8) = uStack_1b30;
    lVar33 = local_848 * 0xf0;
    *(undefined8 *)((long)&lbbox + lVar33) = local_1b28._0_8_;
    *(undefined8 *)((long)&lbbox + lVar33 + 0x10) = local_1b18._0_8_;
    *(undefined8 *)((long)&lbbox + lVar33 + 0x18) = local_1b18._8_8_;
    *(undefined8 *)((long)&lbbox + lVar33 + 0x20) = local_1b08._0_8_;
    *(undefined8 *)((long)&lbbox + lVar33 + 0x28) = local_1b08._8_8_;
    *(undefined8 *)((long)&lbbox + lVar33 + 0x30) = local_1af8._0_8_;
    *(undefined8 *)((long)&lbbox + lVar33 + 0x38) = local_1af8._8_8_;
    *(undefined8 *)(&local_1788 + uVar46 * 0xf) = local_1ae8;
    *(undefined8 *)((long)&local_1788 + uVar46 * 0xf0 + 8) = uStack_1ae0;
    *(undefined8 *)((long)&local_1778 + uVar46 * 0xf0) = local_1ad8;
    *(undefined8 *)((long)&local_1778 + uVar46 * 0xf0 + 8) = uStack_1ad0;
    *(undefined8 *)(&local_1768 + uVar46 * 0xf) = local_1ac8;
    *(undefined8 *)((long)&local_1768 + uVar46 * 0xf0 + 8) = uStack_1ac0;
    local_1758[uVar46 * 0x1e] = local_1ab8;
    *(size_t *)(local_1748 + lVar33 + -8) = sStack_1ab0;
    *(size_t *)(local_1748 + lVar33) = local_1aa8;
    *(size_t *)(local_1748 + lVar33 + 8) = sStack_1aa0;
    (&local_1738)[uVar46 * 0x1e] = local_1a98;
    local_1728[uVar46 * 0x1e + -1] = pmStack_1a90;
    local_1728[uVar46 * 0x1e] = local_1a88;
    uVar42 = local_1db8[1];
    *(undefined8 *)((long)local_1718 + lVar33) = *local_1db8;
    *(undefined8 *)((long)local_1718 + lVar33 + 8) = uVar42;
    *(undefined8 *)((long)local_1718 + lVar33 + 0x10) = local_1a68;
    *(undefined8 *)((long)local_1718 + lVar33 + 0x20) = local_1a58;
    *(undefined8 *)((long)local_1718 + lVar33 + 0x28) = uStack_1a50;
    *(undefined8 *)((long)local_1718 + lVar33 + 0x30) = local_1a48;
    *(undefined8 *)((long)local_1718 + lVar33 + 0x38) = uStack_1a40;
    local_848 = local_848 + 1;
    if (local_1e20 !=
        (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
         *)0x0) {
      std::
      default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
      ::operator()((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                    *)&local_1e20,local_1e20);
    }
    BVar43._1_7_ = local_1dd0._1_7_;
    BVar43.lower._0_1_ = local_1dd0.lower._0_1_ | bVar49;
  } while (local_848 < *(ulong *)local_1e08._0_8_);
  if (local_848 != 0) {
LAB_00c76427:
    pfVar35 = &fStack_172c;
    uVar46 = local_848;
    do {
      BVar43.lower._0_1_ =
           BVar43.lower._0_1_ |
           -(*pfVar35 < (in->prims).super_PrimInfoMB.time_range.upper ||
            (in->prims).super_PrimInfoMB.time_range.lower < pfVar35[-1]);
      BVar43._1_7_ = 0;
      pfVar35 = pfVar35 + 0x3c;
      uVar46 = uVar46 - 1;
    } while (uVar46 != 0);
  }
LAB_00c76471:
  if (((ulong)BVar43 & 1) == 0) {
    right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
         0xe0;
    pTVar8 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar8->alloc)._M_b._M_p) {
      local_1b28._8_1_ = 1;
      local_1b28._0_8_ = pTVar8;
      MutexSys::lock(&pTVar8->mutex);
      if ((pTVar8->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar2 = &((pTVar8->alloc)._M_b._M_p)->bytesUsed;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar8->alloc1).bytesUsed + (pTVar8->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar8->alloc)._M_b._M_p)->bytesFree;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar8->alloc0).end + (pTVar8->alloc1).end) -
             ((pTVar8->alloc0).cur + (pTVar8->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar8->alloc)._M_b._M_p)->bytesWasted;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar8->alloc1).bytesWasted + (pTVar8->alloc0).bytesWasted;
        UNLOCK();
      }
      (pTVar8->alloc0).bytesUsed = 0;
      (pTVar8->alloc0).bytesWasted = 0;
      (pTVar8->alloc0).end = 0;
      (pTVar8->alloc0).allocBlockSize = 0;
      (pTVar8->alloc0).ptr = (char *)0x0;
      (pTVar8->alloc0).cur = 0;
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar8->alloc1).bytesUsed = 0;
        (pTVar8->alloc1).bytesWasted = 0;
        (pTVar8->alloc1).end = 0;
        (pTVar8->alloc1).allocBlockSize = 0;
        (pTVar8->alloc1).ptr = (char *)0x0;
        (pTVar8->alloc1).cur = 0;
      }
      else {
        (pTVar8->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar8->alloc1).ptr = (char *)0x0;
        (pTVar8->alloc1).cur = 0;
        (pTVar8->alloc1).end = 0;
        (pTVar8->alloc1).allocBlockSize = 0;
        (pTVar8->alloc1).bytesUsed = 0;
        (pTVar8->alloc1).bytesWasted = 0;
        (pTVar8->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar8->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      lbbox_1.bounds0.lower.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
      lbbox_1.bounds0.lower.field_0._8_1_ = 1;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           pTVar8;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar9._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar9._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar9,(ThreadLocal2 **)&left);
      }
      else {
        *iVar9._M_current =
             (ThreadLocal2 *)
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        pppTVar3 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar3 = *pppTVar3 + 1;
      }
      MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      if (local_1b28._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)local_1b28._0_8_);
      }
    }
    (alloc.talloc0)->bytesUsed =
         (alloc.talloc0)->bytesUsed +
         right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
    ;
    sVar30 = (alloc.talloc0)->cur;
    uVar46 = (ulong)(-(int)sVar30 & 0xf);
    uVar47 = sVar30 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                      field_0._0_8_ + uVar46;
    (alloc.talloc0)->cur = uVar47;
    if ((alloc.talloc0)->end < uVar47) {
      (alloc.talloc0)->cur = sVar30;
      if ((alloc.talloc0)->allocBlockSize <
          (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                  field_0._0_8_ << 2)) {
        pcVar39 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
      }
      else {
        lbbox_1.bounds0.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
        pcVar39 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&lbbox_1);
        (alloc.talloc0)->ptr = pcVar39;
        sVar30 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar30;
        (alloc.talloc0)->end = lbbox_1.bounds0.lower.field_0._0_8_;
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)lbbox_1.bounds0.lower.field_0._0_8_ <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          lbbox_1.bounds0.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
          pcVar39 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&lbbox_1);
          (alloc.talloc0)->ptr = pcVar39;
          sVar30 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar30;
          (alloc.talloc0)->end = lbbox_1.bounds0.lower.field_0._0_8_;
          (alloc.talloc0)->cur =
               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0
               ._0_8_;
          if ((ulong)lbbox_1.bounds0.lower.field_0._0_8_ <
              (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0._0_8_) {
            (alloc.talloc0)->cur = 0;
            pcVar39 = (char *)0x0;
            goto LAB_00c7687f;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar30;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar46;
      pcVar39 = (alloc.talloc0)->ptr +
                (uVar47 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                          lower.field_0._0_8_);
    }
LAB_00c7687f:
    pcVar39[0x60] = '\0';
    pcVar39[0x61] = '\0';
    pcVar39[0x62] = -0x80;
    pcVar39[99] = '\x7f';
    pcVar39[100] = '\0';
    pcVar39[0x65] = '\0';
    pcVar39[0x66] = -0x80;
    pcVar39[0x67] = '\x7f';
    pcVar39[0x68] = '\0';
    pcVar39[0x69] = '\0';
    pcVar39[0x6a] = -0x80;
    pcVar39[0x6b] = '\x7f';
    pcVar39[0x6c] = '\0';
    pcVar39[0x6d] = '\0';
    pcVar39[0x6e] = -0x80;
    pcVar39[0x6f] = '\x7f';
    pcVar39[0x40] = '\0';
    pcVar39[0x41] = '\0';
    pcVar39[0x42] = -0x80;
    pcVar39[0x43] = '\x7f';
    pcVar39[0x44] = '\0';
    pcVar39[0x45] = '\0';
    pcVar39[0x46] = -0x80;
    pcVar39[0x47] = '\x7f';
    pcVar39[0x48] = '\0';
    pcVar39[0x49] = '\0';
    pcVar39[0x4a] = -0x80;
    pcVar39[0x4b] = '\x7f';
    pcVar39[0x4c] = '\0';
    pcVar39[0x4d] = '\0';
    pcVar39[0x4e] = -0x80;
    pcVar39[0x4f] = '\x7f';
    pcVar39[0x20] = '\0';
    pcVar39[0x21] = '\0';
    pcVar39[0x22] = -0x80;
    pcVar39[0x23] = '\x7f';
    pcVar39[0x24] = '\0';
    pcVar39[0x25] = '\0';
    pcVar39[0x26] = -0x80;
    pcVar39[0x27] = '\x7f';
    pcVar39[0x28] = '\0';
    pcVar39[0x29] = '\0';
    pcVar39[0x2a] = -0x80;
    pcVar39[0x2b] = '\x7f';
    pcVar39[0x2c] = '\0';
    pcVar39[0x2d] = '\0';
    pcVar39[0x2e] = -0x80;
    pcVar39[0x2f] = '\x7f';
    pcVar39[0x70] = '\0';
    pcVar39[0x71] = '\0';
    pcVar39[0x72] = -0x80;
    pcVar39[0x73] = -1;
    pcVar39[0x74] = '\0';
    pcVar39[0x75] = '\0';
    pcVar39[0x76] = -0x80;
    pcVar39[0x77] = -1;
    pcVar39[0x78] = '\0';
    pcVar39[0x79] = '\0';
    pcVar39[0x7a] = -0x80;
    pcVar39[0x7b] = -1;
    pcVar39[0x7c] = '\0';
    pcVar39[0x7d] = '\0';
    pcVar39[0x7e] = -0x80;
    pcVar39[0x7f] = -1;
    pcVar39[0x50] = '\0';
    pcVar39[0x51] = '\0';
    pcVar39[0x52] = -0x80;
    pcVar39[0x53] = -1;
    pcVar39[0x54] = '\0';
    pcVar39[0x55] = '\0';
    pcVar39[0x56] = -0x80;
    pcVar39[0x57] = -1;
    pcVar39[0x58] = '\0';
    pcVar39[0x59] = '\0';
    pcVar39[0x5a] = -0x80;
    pcVar39[0x5b] = -1;
    pcVar39[0x5c] = '\0';
    pcVar39[0x5d] = '\0';
    pcVar39[0x5e] = -0x80;
    pcVar39[0x5f] = -1;
    pcVar39[0x30] = '\0';
    pcVar39[0x31] = '\0';
    pcVar39[0x32] = -0x80;
    pcVar39[0x33] = -1;
    pcVar39[0x34] = '\0';
    pcVar39[0x35] = '\0';
    pcVar39[0x36] = -0x80;
    pcVar39[0x37] = -1;
    pcVar39[0x38] = '\0';
    pcVar39[0x39] = '\0';
    pcVar39[0x3a] = -0x80;
    pcVar39[0x3b] = -1;
    pcVar39[0x3c] = '\0';
    pcVar39[0x3d] = '\0';
    pcVar39[0x3e] = -0x80;
    pcVar39[0x3f] = -1;
    pcVar39[0x80] = '\0';
    pcVar39[0x81] = '\0';
    pcVar39[0x82] = '\0';
    pcVar39[0x83] = '\0';
    pcVar39[0x84] = '\0';
    pcVar39[0x85] = '\0';
    pcVar39[0x86] = '\0';
    pcVar39[0x87] = '\0';
    pcVar39[0x88] = '\0';
    pcVar39[0x89] = '\0';
    pcVar39[0x8a] = '\0';
    pcVar39[0x8b] = '\0';
    pcVar39[0x8c] = '\0';
    pcVar39[0x8d] = '\0';
    pcVar39[0x8e] = '\0';
    pcVar39[0x8f] = '\0';
    pcVar39[0x90] = '\0';
    pcVar39[0x91] = '\0';
    pcVar39[0x92] = '\0';
    pcVar39[0x93] = '\0';
    pcVar39[0x94] = '\0';
    pcVar39[0x95] = '\0';
    pcVar39[0x96] = '\0';
    pcVar39[0x97] = '\0';
    pcVar39[0x98] = '\0';
    pcVar39[0x99] = '\0';
    pcVar39[0x9a] = '\0';
    pcVar39[0x9b] = '\0';
    pcVar39[0x9c] = '\0';
    pcVar39[0x9d] = '\0';
    pcVar39[0x9e] = '\0';
    pcVar39[0x9f] = '\0';
    pcVar39[0xa0] = '\0';
    pcVar39[0xa1] = '\0';
    pcVar39[0xa2] = '\0';
    pcVar39[0xa3] = '\0';
    pcVar39[0xa4] = '\0';
    pcVar39[0xa5] = '\0';
    pcVar39[0xa6] = '\0';
    pcVar39[0xa7] = '\0';
    pcVar39[0xa8] = '\0';
    pcVar39[0xa9] = '\0';
    pcVar39[0xaa] = '\0';
    pcVar39[0xab] = '\0';
    pcVar39[0xac] = '\0';
    pcVar39[0xad] = '\0';
    pcVar39[0xae] = '\0';
    pcVar39[0xaf] = '\0';
    pcVar39[0xb0] = '\0';
    pcVar39[0xb1] = '\0';
    pcVar39[0xb2] = '\0';
    pcVar39[0xb3] = '\0';
    pcVar39[0xb4] = '\0';
    pcVar39[0xb5] = '\0';
    pcVar39[0xb6] = '\0';
    pcVar39[0xb7] = '\0';
    pcVar39[0xb8] = '\0';
    pcVar39[0xb9] = '\0';
    pcVar39[0xba] = '\0';
    pcVar39[0xbb] = '\0';
    pcVar39[0xbc] = '\0';
    pcVar39[0xbd] = '\0';
    pcVar39[0xbe] = '\0';
    pcVar39[0xbf] = '\0';
    pcVar39[0xc0] = '\0';
    pcVar39[0xc1] = '\0';
    pcVar39[0xc2] = '\0';
    pcVar39[0xc3] = '\0';
    pcVar39[0xc4] = '\0';
    pcVar39[0xc5] = '\0';
    pcVar39[0xc6] = '\0';
    pcVar39[199] = '\0';
    pcVar39[200] = '\0';
    pcVar39[0xc9] = '\0';
    pcVar39[0xca] = '\0';
    pcVar39[0xcb] = '\0';
    pcVar39[0xcc] = '\0';
    pcVar39[0xcd] = '\0';
    pcVar39[0xce] = '\0';
    pcVar39[0xcf] = '\0';
    pcVar39[0xd0] = '\0';
    pcVar39[0xd1] = '\0';
    pcVar39[0xd2] = '\0';
    pcVar39[0xd3] = '\0';
    pcVar39[0xd4] = '\0';
    pcVar39[0xd5] = '\0';
    pcVar39[0xd6] = '\0';
    pcVar39[0xd7] = '\0';
    pcVar39[0xd8] = '\0';
    pcVar39[0xd9] = '\0';
    pcVar39[0xda] = '\0';
    pcVar39[0xdb] = '\0';
    pcVar39[0xdc] = '\0';
    pcVar39[0xdd] = '\0';
    pcVar39[0xde] = '\0';
    pcVar39[0xdf] = '\0';
    pcVar39[0] = '\b';
    pcVar39[1] = '\0';
    pcVar39[2] = '\0';
    pcVar39[3] = '\0';
    pcVar39[4] = '\0';
    pcVar39[5] = '\0';
    pcVar39[6] = '\0';
    pcVar39[7] = '\0';
    pcVar39[8] = '\b';
    pcVar39[9] = '\0';
    pcVar39[10] = '\0';
    pcVar39[0xb] = '\0';
    pcVar39[0xc] = '\0';
    pcVar39[0xd] = '\0';
    pcVar39[0xe] = '\0';
    pcVar39[0xf] = '\0';
    pcVar39[0x10] = '\b';
    pcVar39[0x11] = '\0';
    pcVar39[0x12] = '\0';
    pcVar39[0x13] = '\0';
    pcVar39[0x14] = '\0';
    pcVar39[0x15] = '\0';
    pcVar39[0x16] = '\0';
    pcVar39[0x17] = '\0';
    pcVar39[0x18] = '\b';
    pcVar39[0x19] = '\0';
    pcVar39[0x1a] = '\0';
    pcVar39[0x1b] = '\0';
    pcVar39[0x1c] = '\0';
    pcVar39[0x1d] = '\0';
    pcVar39[0x1e] = '\0';
    pcVar39[0x1f] = '\0';
    uVar47 = 1;
    uVar46 = 0;
    goto LAB_00c768ee;
  }
  right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
       0x100;
  pTVar8 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar8->alloc)._M_b._M_p) {
    local_1b28._8_1_ = 1;
    local_1b28._0_8_ = pTVar8;
    MutexSys::lock(&pTVar8->mutex);
    if ((pTVar8->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar2 = &((pTVar8->alloc)._M_b._M_p)->bytesUsed;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (pTVar8->alloc1).bytesUsed + (pTVar8->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar2 = &((pTVar8->alloc)._M_b._M_p)->bytesFree;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar8->alloc0).end + (pTVar8->alloc1).end) -
           ((pTVar8->alloc0).cur + (pTVar8->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar2 = &((pTVar8->alloc)._M_b._M_p)->bytesWasted;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (pTVar8->alloc1).bytesWasted + (pTVar8->alloc0).bytesWasted;
      UNLOCK();
    }
    (pTVar8->alloc0).bytesUsed = 0;
    (pTVar8->alloc0).bytesWasted = 0;
    (pTVar8->alloc0).end = 0;
    (pTVar8->alloc0).allocBlockSize = 0;
    (pTVar8->alloc0).ptr = (char *)0x0;
    (pTVar8->alloc0).cur = 0;
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar8->alloc1).bytesUsed = 0;
      (pTVar8->alloc1).bytesWasted = 0;
      (pTVar8->alloc1).end = 0;
      (pTVar8->alloc1).allocBlockSize = 0;
      (pTVar8->alloc1).ptr = (char *)0x0;
      (pTVar8->alloc1).cur = 0;
    }
    else {
      (pTVar8->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar8->alloc1).ptr = (char *)0x0;
      (pTVar8->alloc1).cur = 0;
      (pTVar8->alloc1).end = 0;
      (pTVar8->alloc1).allocBlockSize = 0;
      (pTVar8->alloc1).bytesUsed = 0;
      (pTVar8->alloc1).bytesWasted = 0;
      (pTVar8->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar8->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    lbbox_1.bounds0.lower.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
    lbbox_1.bounds0.lower.field_0._8_1_ = 1;
    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
         pTVar8;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    iVar9._M_current =
         ((alloc.alloc)->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar9._M_current ==
        ((alloc.alloc)->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(alloc.alloc)->thread_local_allocators,iVar9,(ThreadLocal2 **)&left);
    }
    else {
      *iVar9._M_current =
           (ThreadLocal2 *)
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      pppTVar3 = &((alloc.alloc)->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar3 = *pppTVar3 + 1;
    }
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    if (local_1b28._8_1_ == '\x01') {
      MutexSys::unlock((MutexSys *)local_1b28._0_8_);
    }
  }
  (alloc.talloc0)->bytesUsed =
       (alloc.talloc0)->bytesUsed +
       right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
  sVar30 = (alloc.talloc0)->cur;
  uVar46 = (ulong)(-(int)sVar30 & 0xf);
  uVar47 = sVar30 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0._0_8_ + uVar46;
  (alloc.talloc0)->cur = uVar47;
  if ((alloc.talloc0)->end < uVar47) {
    (alloc.talloc0)->cur = sVar30;
    if ((alloc.talloc0)->allocBlockSize <
        (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                field_0._0_8_ << 2)) {
      pcVar39 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
    }
    else {
      lbbox_1.bounds0.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
      pcVar39 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&lbbox_1);
      (alloc.talloc0)->ptr = pcVar39;
      sVar30 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar30;
      (alloc.talloc0)->end = lbbox_1.bounds0.lower.field_0._0_8_;
      (alloc.talloc0)->cur =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      if ((ulong)lbbox_1.bounds0.lower.field_0._0_8_ <
          (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                 field_0._0_8_) {
        (alloc.talloc0)->cur = 0;
        lbbox_1.bounds0.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
        pcVar39 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&lbbox_1);
        (alloc.talloc0)->ptr = pcVar39;
        sVar30 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar30;
        (alloc.talloc0)->end = lbbox_1.bounds0.lower.field_0._0_8_;
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)lbbox_1.bounds0.lower.field_0._0_8_ <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          pcVar39 = (char *)0x0;
          goto LAB_00c76781;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar30;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar46;
    pcVar39 = (alloc.talloc0)->ptr +
              (uVar47 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                        lower.field_0._0_8_);
  }
LAB_00c76781:
  pcVar39[0xe0] = '\0';
  pcVar39[0xe1] = '\0';
  pcVar39[0xe2] = -0x80;
  pcVar39[0xe3] = '\x7f';
  pcVar39[0xe4] = '\0';
  pcVar39[0xe5] = '\0';
  pcVar39[0xe6] = -0x80;
  pcVar39[0xe7] = '\x7f';
  pcVar39[0xe8] = '\0';
  pcVar39[0xe9] = '\0';
  pcVar39[0xea] = -0x80;
  pcVar39[0xeb] = '\x7f';
  pcVar39[0xec] = '\0';
  pcVar39[0xed] = '\0';
  pcVar39[0xee] = -0x80;
  pcVar39[0xef] = '\x7f';
  pcVar39[0xf0] = '\0';
  pcVar39[0xf1] = '\0';
  pcVar39[0xf2] = -0x80;
  pcVar39[0xf3] = -1;
  pcVar39[0xf4] = '\0';
  pcVar39[0xf5] = '\0';
  pcVar39[0xf6] = -0x80;
  pcVar39[0xf7] = -1;
  pcVar39[0xf8] = '\0';
  pcVar39[0xf9] = '\0';
  pcVar39[0xfa] = -0x80;
  pcVar39[0xfb] = -1;
  pcVar39[0xfc] = '\0';
  pcVar39[0xfd] = '\0';
  pcVar39[0xfe] = -0x80;
  pcVar39[0xff] = -1;
  pcVar39[0x60] = '\0';
  pcVar39[0x61] = '\0';
  pcVar39[0x62] = -0x80;
  pcVar39[99] = '\x7f';
  pcVar39[100] = '\0';
  pcVar39[0x65] = '\0';
  pcVar39[0x66] = -0x80;
  pcVar39[0x67] = '\x7f';
  pcVar39[0x68] = '\0';
  pcVar39[0x69] = '\0';
  pcVar39[0x6a] = -0x80;
  pcVar39[0x6b] = '\x7f';
  pcVar39[0x6c] = '\0';
  pcVar39[0x6d] = '\0';
  pcVar39[0x6e] = -0x80;
  pcVar39[0x6f] = '\x7f';
  pcVar39[0x40] = '\0';
  pcVar39[0x41] = '\0';
  pcVar39[0x42] = -0x80;
  pcVar39[0x43] = '\x7f';
  pcVar39[0x44] = '\0';
  pcVar39[0x45] = '\0';
  pcVar39[0x46] = -0x80;
  pcVar39[0x47] = '\x7f';
  pcVar39[0x48] = '\0';
  pcVar39[0x49] = '\0';
  pcVar39[0x4a] = -0x80;
  pcVar39[0x4b] = '\x7f';
  pcVar39[0x4c] = '\0';
  pcVar39[0x4d] = '\0';
  pcVar39[0x4e] = -0x80;
  pcVar39[0x4f] = '\x7f';
  pcVar39[0x20] = '\0';
  pcVar39[0x21] = '\0';
  pcVar39[0x22] = -0x80;
  pcVar39[0x23] = '\x7f';
  pcVar39[0x24] = '\0';
  pcVar39[0x25] = '\0';
  pcVar39[0x26] = -0x80;
  pcVar39[0x27] = '\x7f';
  pcVar39[0x28] = '\0';
  pcVar39[0x29] = '\0';
  pcVar39[0x2a] = -0x80;
  pcVar39[0x2b] = '\x7f';
  pcVar39[0x2c] = '\0';
  pcVar39[0x2d] = '\0';
  pcVar39[0x2e] = -0x80;
  pcVar39[0x2f] = '\x7f';
  pcVar39[0x70] = '\0';
  pcVar39[0x71] = '\0';
  pcVar39[0x72] = -0x80;
  pcVar39[0x73] = -1;
  pcVar39[0x74] = '\0';
  pcVar39[0x75] = '\0';
  pcVar39[0x76] = -0x80;
  pcVar39[0x77] = -1;
  pcVar39[0x78] = '\0';
  pcVar39[0x79] = '\0';
  pcVar39[0x7a] = -0x80;
  pcVar39[0x7b] = -1;
  pcVar39[0x7c] = '\0';
  pcVar39[0x7d] = '\0';
  pcVar39[0x7e] = -0x80;
  pcVar39[0x7f] = -1;
  pcVar39[0x50] = '\0';
  pcVar39[0x51] = '\0';
  pcVar39[0x52] = -0x80;
  pcVar39[0x53] = -1;
  pcVar39[0x54] = '\0';
  pcVar39[0x55] = '\0';
  pcVar39[0x56] = -0x80;
  pcVar39[0x57] = -1;
  pcVar39[0x58] = '\0';
  pcVar39[0x59] = '\0';
  pcVar39[0x5a] = -0x80;
  pcVar39[0x5b] = -1;
  pcVar39[0x5c] = '\0';
  pcVar39[0x5d] = '\0';
  pcVar39[0x5e] = -0x80;
  pcVar39[0x5f] = -1;
  pcVar39[0x30] = '\0';
  pcVar39[0x31] = '\0';
  pcVar39[0x32] = -0x80;
  pcVar39[0x33] = -1;
  pcVar39[0x34] = '\0';
  pcVar39[0x35] = '\0';
  pcVar39[0x36] = -0x80;
  pcVar39[0x37] = -1;
  pcVar39[0x38] = '\0';
  pcVar39[0x39] = '\0';
  pcVar39[0x3a] = -0x80;
  pcVar39[0x3b] = -1;
  pcVar39[0x3c] = '\0';
  pcVar39[0x3d] = '\0';
  pcVar39[0x3e] = -0x80;
  pcVar39[0x3f] = -1;
  pcVar39[0x80] = '\0';
  pcVar39[0x81] = '\0';
  pcVar39[0x82] = '\0';
  pcVar39[0x83] = '\0';
  pcVar39[0x84] = '\0';
  pcVar39[0x85] = '\0';
  pcVar39[0x86] = '\0';
  pcVar39[0x87] = '\0';
  pcVar39[0x88] = '\0';
  pcVar39[0x89] = '\0';
  pcVar39[0x8a] = '\0';
  pcVar39[0x8b] = '\0';
  pcVar39[0x8c] = '\0';
  pcVar39[0x8d] = '\0';
  pcVar39[0x8e] = '\0';
  pcVar39[0x8f] = '\0';
  pcVar39[0x90] = '\0';
  pcVar39[0x91] = '\0';
  pcVar39[0x92] = '\0';
  pcVar39[0x93] = '\0';
  pcVar39[0x94] = '\0';
  pcVar39[0x95] = '\0';
  pcVar39[0x96] = '\0';
  pcVar39[0x97] = '\0';
  pcVar39[0x98] = '\0';
  pcVar39[0x99] = '\0';
  pcVar39[0x9a] = '\0';
  pcVar39[0x9b] = '\0';
  pcVar39[0x9c] = '\0';
  pcVar39[0x9d] = '\0';
  pcVar39[0x9e] = '\0';
  pcVar39[0x9f] = '\0';
  pcVar39[0xa0] = '\0';
  pcVar39[0xa1] = '\0';
  pcVar39[0xa2] = '\0';
  pcVar39[0xa3] = '\0';
  pcVar39[0xa4] = '\0';
  pcVar39[0xa5] = '\0';
  pcVar39[0xa6] = '\0';
  pcVar39[0xa7] = '\0';
  pcVar39[0xa8] = '\0';
  pcVar39[0xa9] = '\0';
  pcVar39[0xaa] = '\0';
  pcVar39[0xab] = '\0';
  pcVar39[0xac] = '\0';
  pcVar39[0xad] = '\0';
  pcVar39[0xae] = '\0';
  pcVar39[0xaf] = '\0';
  pcVar39[0xb0] = '\0';
  pcVar39[0xb1] = '\0';
  pcVar39[0xb2] = '\0';
  pcVar39[0xb3] = '\0';
  pcVar39[0xb4] = '\0';
  pcVar39[0xb5] = '\0';
  pcVar39[0xb6] = '\0';
  pcVar39[0xb7] = '\0';
  pcVar39[0xb8] = '\0';
  pcVar39[0xb9] = '\0';
  pcVar39[0xba] = '\0';
  pcVar39[0xbb] = '\0';
  pcVar39[0xbc] = '\0';
  pcVar39[0xbd] = '\0';
  pcVar39[0xbe] = '\0';
  pcVar39[0xbf] = '\0';
  pcVar39[0xc0] = '\0';
  pcVar39[0xc1] = '\0';
  pcVar39[0xc2] = '\0';
  pcVar39[0xc3] = '\0';
  pcVar39[0xc4] = '\0';
  pcVar39[0xc5] = '\0';
  pcVar39[0xc6] = '\0';
  pcVar39[199] = '\0';
  pcVar39[200] = '\0';
  pcVar39[0xc9] = '\0';
  pcVar39[0xca] = '\0';
  pcVar39[0xcb] = '\0';
  pcVar39[0xcc] = '\0';
  pcVar39[0xcd] = '\0';
  pcVar39[0xce] = '\0';
  pcVar39[0xcf] = '\0';
  pcVar39[0xd0] = '\0';
  pcVar39[0xd1] = '\0';
  pcVar39[0xd2] = '\0';
  pcVar39[0xd3] = '\0';
  pcVar39[0xd4] = '\0';
  pcVar39[0xd5] = '\0';
  pcVar39[0xd6] = '\0';
  pcVar39[0xd7] = '\0';
  pcVar39[0xd8] = '\0';
  pcVar39[0xd9] = '\0';
  pcVar39[0xda] = '\0';
  pcVar39[0xdb] = '\0';
  pcVar39[0xdc] = '\0';
  pcVar39[0xdd] = '\0';
  pcVar39[0xde] = '\0';
  pcVar39[0xdf] = '\0';
  pcVar39[0] = '\b';
  pcVar39[1] = '\0';
  pcVar39[2] = '\0';
  pcVar39[3] = '\0';
  pcVar39[4] = '\0';
  pcVar39[5] = '\0';
  pcVar39[6] = '\0';
  pcVar39[7] = '\0';
  pcVar39[8] = '\b';
  pcVar39[9] = '\0';
  pcVar39[10] = '\0';
  pcVar39[0xb] = '\0';
  pcVar39[0xc] = '\0';
  pcVar39[0xd] = '\0';
  pcVar39[0xe] = '\0';
  pcVar39[0xf] = '\0';
  pcVar39[0x10] = '\b';
  pcVar39[0x11] = '\0';
  pcVar39[0x12] = '\0';
  pcVar39[0x13] = '\0';
  pcVar39[0x14] = '\0';
  pcVar39[0x15] = '\0';
  pcVar39[0x16] = '\0';
  pcVar39[0x17] = '\0';
  pcVar39[0x18] = '\b';
  pcVar39[0x19] = '\0';
  pcVar39[0x1a] = '\0';
  pcVar39[0x1b] = '\0';
  pcVar39[0x1c] = '\0';
  pcVar39[0x1d] = '\0';
  pcVar39[0x1e] = '\0';
  pcVar39[0x1f] = '\0';
  uVar46 = CONCAT71((int7)((ulong)in_R8 >> 8),1);
  uVar47 = 6;
LAB_00c768ee:
  local_1e18._8_8_ = 0xff800000ff800000;
  local_1e18._0_8_ = 0xff800000ff800000;
  uVar42 = local_1e08._0_8_;
  uVar52 = 0x7f8000007f800000;
  uVar54 = 0x7f8000007f800000;
  if (local_848 != 0) {
    local_1db8 = (undefined8 *)CONCAT44(local_1db8._4_4_,(int)uVar46);
    pBVar36 = &values[0].dt;
    uVar46 = 0;
    local_1dc8._8_8_ = 0x7f8000007f800000;
    local_1dc8._0_8_ = 0x7f8000007f800000;
    local_1df8._8_8_ = 0x7f8000007f800000;
    local_1df8._0_8_ = 0x7f8000007f800000;
    local_1de8._8_8_ = 0xff800000ff800000;
    local_1de8._0_8_ = 0xff800000ff800000;
    local_1e18._8_8_ = 0xff800000ff800000;
    local_1e18._0_8_ = 0xff800000ff800000;
    in_00 = (BuildRecord *)&lbbox;
    do {
      createLargeLeaf((NodeRecordMB4D *)&lbbox_1,
                      (BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
                       *)local_1e08._0_8_,in_00,alloc);
      auVar75 = _DAT_01f80810;
      auVar56 = _DAT_01f80800;
      pBVar36[-10].lower = (float)lbbox_1.bounds0.lower.field_0._0_4_;
      pBVar36[-10].upper = (float)lbbox_1.bounds0.lower.field_0._4_4_;
      auVar58._8_8_ = lbbox_1.bounds0.upper.field_0._8_8_;
      auVar58._0_8_ = lbbox_1.bounds0.upper.field_0._0_8_;
      *(undefined1 (*) [16])(pBVar36 + -8) = auVar58;
      auVar60._8_8_ = lbbox_1.bounds1.lower.field_0._8_8_;
      auVar60._0_8_ = lbbox_1.bounds1.lower.field_0._0_8_;
      *(undefined1 (*) [16])(pBVar36 + -6) = auVar60;
      auVar63._8_8_ = lbbox_1.bounds1.upper.field_0._8_8_;
      auVar63._0_8_ = lbbox_1.bounds1.upper.field_0._0_8_;
      *(undefined1 (*) [16])(pBVar36 + -4) = auVar63;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
       ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar36 + -2))->m128 = local_1bd8;
      *pBVar36 = local_1bc8;
      local_1dc8.m128 = (__m128)minps(local_1dc8.m128,auVar58);
      local_1de8.m128 = (__m128)maxps(local_1de8.m128,auVar60);
      local_1df8.m128 = (__m128)minps(local_1df8.m128,auVar63);
      local_1e18.m128 = (__m128)maxps(local_1e18.m128,local_1bd8.m128);
      uVar46 = uVar46 + 1;
      pBVar36 = pBVar36 + 0xc;
      in_00 = (BuildRecord *)
              &in_00[1].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds1.upper;
    } while (uVar46 < local_848);
    if (((uint)uVar47 | (uint)pcVar39 & 0xf) == 1) {
      if (local_848 != 0) {
        uVar40 = (ulong)pcVar39 & 0xfffffffffffffff0;
        pfVar35 = &values[0].dt.upper;
        uVar46 = 0;
        do {
          *(undefined8 *)(uVar40 + uVar46 * 8) = *(undefined8 *)(pfVar35 + -0x15);
          fVar65 = ((BBox1f *)(pfVar35 + -1))->lower;
          fVar64 = 1.0 / (*pfVar35 - fVar65);
          fVar70 = -fVar65 * fVar64;
          fVar61 = 1.0 - fVar70;
          auVar59._0_4_ = pfVar35[-0x11] * fVar61 + pfVar35[-9] * fVar70;
          auVar59._4_4_ = pfVar35[-0x10] * fVar61 + pfVar35[-8] * fVar70;
          auVar59._8_4_ = pfVar35[-0xf] * fVar61 + pfVar35[-7] * fVar70;
          auVar59._12_4_ = pfVar35[-0xe] * fVar61 + pfVar35[-6] * fVar70;
          auVar62._0_4_ = fVar61 * pfVar35[-0xd] + fVar70 * pfVar35[-5];
          auVar62._4_4_ = fVar61 * pfVar35[-0xc] + fVar70 * pfVar35[-4];
          auVar62._8_4_ = fVar61 * pfVar35[-0xb] + fVar70 * pfVar35[-3];
          auVar62._12_4_ = fVar61 * pfVar35[-10] + fVar70 * pfVar35[-2];
          fVar64 = (1.0 - fVar65) * fVar64;
          fVar65 = 1.0 - fVar64;
          auVar57._0_4_ = pfVar35[-0x11] * fVar65 + pfVar35[-9] * fVar64;
          auVar57._4_4_ = pfVar35[-0x10] * fVar65 + pfVar35[-8] * fVar64;
          auVar57._8_4_ = pfVar35[-0xf] * fVar65 + pfVar35[-7] * fVar64;
          auVar57._12_4_ = pfVar35[-0xe] * fVar65 + pfVar35[-6] * fVar64;
          auVar66._0_4_ = fVar65 * pfVar35[-0xd] + fVar64 * pfVar35[-5];
          auVar66._4_4_ = fVar65 * pfVar35[-0xc] + fVar64 * pfVar35[-4];
          auVar66._8_4_ = fVar65 * pfVar35[-0xb] + fVar64 * pfVar35[-3];
          auVar66._12_4_ = fVar65 * pfVar35[-10] + fVar64 * pfVar35[-2];
          auVar60 = minps(auVar59,auVar75);
          auVar63 = maxps(auVar62,auVar56);
          auVar58 = minps(auVar57,auVar75);
          auVar67 = maxps(auVar66,auVar56);
          fVar65 = auVar60._0_4_ - ABS(auVar60._0_4_) * 4.7683716e-07;
          fVar61 = auVar60._4_4_ - ABS(auVar60._4_4_) * 4.7683716e-07;
          fVar64 = auVar60._8_4_ - ABS(auVar60._8_4_) * 4.7683716e-07;
          fVar70 = ABS(auVar63._0_4_) * 4.7683716e-07 + auVar63._0_4_;
          fVar68 = ABS(auVar63._4_4_) * 4.7683716e-07 + auVar63._4_4_;
          fVar69 = ABS(auVar63._8_4_) * 4.7683716e-07 + auVar63._8_4_;
          *(float *)(uVar40 + 0x20 + uVar46 * 4) = fVar65;
          *(float *)(uVar40 + 0x40 + uVar46 * 4) = fVar61;
          *(float *)(uVar40 + 0x60 + uVar46 * 4) = fVar64;
          *(float *)(uVar40 + 0x30 + uVar46 * 4) = fVar70;
          *(float *)(uVar40 + 0x50 + uVar46 * 4) = fVar68;
          *(float *)(uVar40 + 0x70 + uVar46 * 4) = fVar69;
          *(float *)(uVar40 + 0x80 + uVar46 * 4) =
               (auVar58._0_4_ - ABS(auVar58._0_4_) * 4.7683716e-07) - fVar65;
          *(float *)(uVar40 + 0xa0 + uVar46 * 4) =
               (auVar58._4_4_ - ABS(auVar58._4_4_) * 4.7683716e-07) - fVar61;
          *(float *)(uVar40 + 0xc0 + uVar46 * 4) =
               (auVar58._8_4_ - ABS(auVar58._8_4_) * 4.7683716e-07) - fVar64;
          *(float *)(uVar40 + 0x90 + uVar46 * 4) =
               (ABS(auVar67._0_4_) * 4.7683716e-07 + auVar67._0_4_) - fVar70;
          *(float *)(uVar40 + 0xb0 + uVar46 * 4) =
               (ABS(auVar67._4_4_) * 4.7683716e-07 + auVar67._4_4_) - fVar68;
          *(float *)(uVar40 + 0xd0 + uVar46 * 4) =
               (ABS(auVar67._8_4_) * 4.7683716e-07 + auVar67._8_4_) - fVar69;
          uVar46 = uVar46 + 1;
          pfVar35 = pfVar35 + 0x18;
        } while (local_848 != uVar46);
      }
    }
    else if (local_848 != 0) {
      uVar40 = (ulong)pcVar39 & 0xfffffffffffffff0;
      pfVar35 = &values[0].dt.upper;
      uVar46 = 0;
      do {
        *(undefined8 *)(uVar40 + uVar46 * 8) = *(undefined8 *)(pfVar35 + -0x15);
        fVar65 = *pfVar35;
        fVar61 = ((BBox1f *)(pfVar35 + -1))->lower;
        fVar70 = 1.0 / (fVar65 - fVar61);
        fVar68 = -fVar61 * fVar70;
        fVar64 = 1.0 - fVar68;
        auVar67._0_4_ = pfVar35[-0x11] * fVar64 + pfVar35[-9] * fVar68;
        auVar67._4_4_ = pfVar35[-0x10] * fVar64 + pfVar35[-8] * fVar68;
        auVar67._8_4_ = pfVar35[-0xf] * fVar64 + pfVar35[-7] * fVar68;
        auVar67._12_4_ = pfVar35[-0xe] * fVar64 + pfVar35[-6] * fVar68;
        auVar73._0_4_ = fVar64 * pfVar35[-0xd] + fVar68 * pfVar35[-5];
        auVar73._4_4_ = fVar64 * pfVar35[-0xc] + fVar68 * pfVar35[-4];
        auVar73._8_4_ = fVar64 * pfVar35[-0xb] + fVar68 * pfVar35[-3];
        auVar73._12_4_ = fVar64 * pfVar35[-10] + fVar68 * pfVar35[-2];
        fVar70 = (1.0 - fVar61) * fVar70;
        fVar64 = 1.0 - fVar70;
        auVar75._0_4_ = pfVar35[-0x11] * fVar64 + pfVar35[-9] * fVar70;
        auVar75._4_4_ = pfVar35[-0x10] * fVar64 + pfVar35[-8] * fVar70;
        auVar75._8_4_ = pfVar35[-0xf] * fVar64 + pfVar35[-7] * fVar70;
        auVar75._12_4_ = pfVar35[-0xe] * fVar64 + pfVar35[-6] * fVar70;
        auVar74._0_4_ = fVar64 * pfVar35[-0xd] + fVar70 * pfVar35[-5];
        auVar74._4_4_ = fVar64 * pfVar35[-0xc] + fVar70 * pfVar35[-4];
        auVar74._8_4_ = fVar64 * pfVar35[-0xb] + fVar70 * pfVar35[-3];
        auVar74._12_4_ = fVar64 * pfVar35[-10] + fVar70 * pfVar35[-2];
        auVar60 = minps(auVar67,_DAT_01f80810);
        auVar63 = maxps(auVar73,auVar56);
        auVar58 = minps(auVar75,_DAT_01f80810);
        auVar75 = maxps(auVar74,auVar56);
        fVar69 = auVar60._0_4_ - ABS(auVar60._0_4_) * 4.7683716e-07;
        fVar71 = auVar60._4_4_ - ABS(auVar60._4_4_) * 4.7683716e-07;
        fVar72 = auVar60._8_4_ - ABS(auVar60._8_4_) * 4.7683716e-07;
        fVar64 = ABS(auVar63._0_4_) * 4.7683716e-07 + auVar63._0_4_;
        fVar70 = ABS(auVar63._4_4_) * 4.7683716e-07 + auVar63._4_4_;
        fVar68 = ABS(auVar63._8_4_) * 4.7683716e-07 + auVar63._8_4_;
        *(float *)(uVar40 + 0x20 + uVar46 * 4) = fVar69;
        *(float *)(uVar40 + 0x40 + uVar46 * 4) = fVar71;
        *(float *)(uVar40 + 0x60 + uVar46 * 4) = fVar72;
        *(float *)(uVar40 + 0x30 + uVar46 * 4) = fVar64;
        *(float *)(uVar40 + 0x50 + uVar46 * 4) = fVar70;
        *(float *)(uVar40 + 0x70 + uVar46 * 4) = fVar68;
        *(float *)(uVar40 + 0x80 + uVar46 * 4) =
             (auVar58._0_4_ - ABS(auVar58._0_4_) * 4.7683716e-07) - fVar69;
        *(float *)(uVar40 + 0xa0 + uVar46 * 4) =
             (auVar58._4_4_ - ABS(auVar58._4_4_) * 4.7683716e-07) - fVar71;
        *(float *)(uVar40 + 0xc0 + uVar46 * 4) =
             (auVar58._8_4_ - ABS(auVar58._8_4_) * 4.7683716e-07) - fVar72;
        *(float *)(uVar40 + 0x90 + uVar46 * 4) =
             (ABS(auVar75._0_4_) * 4.7683716e-07 + auVar75._0_4_) - fVar64;
        *(float *)(uVar40 + 0xb0 + uVar46 * 4) =
             (ABS(auVar75._4_4_) * 4.7683716e-07 + auVar75._4_4_) - fVar70;
        *(float *)(uVar40 + 0xd0 + uVar46 * 4) =
             (ABS(auVar75._8_4_) * 4.7683716e-07 + auVar75._8_4_) - fVar68;
        *(float *)(uVar40 + 0xe0 + uVar46 * 4) = fVar61;
        *(uint *)(uVar40 + 0xf0 + uVar46 * 4) =
             ~-(uint)(fVar65 == 1.0) & (uint)fVar65 | -(uint)(fVar65 == 1.0) & 0x3f800001;
        uVar46 = uVar46 + 1;
        pfVar35 = pfVar35 + 0x18;
      } while (local_848 != uVar46);
    }
    uVar46 = (ulong)local_1db8 & 0xffffffff;
    uVar42 = local_1e08._0_8_;
    uVar52 = local_1df8._0_8_;
    uVar54 = local_1df8._8_8_;
  }
  uVar23 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
  uVar22 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
  if ((char)uVar46 == '\0') {
    (__return_storage_ptr__->ref).ptr = uVar47 | (ulong)pcVar39;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 = local_1dc8._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         local_1dc8._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = local_1de8._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         local_1de8._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = uVar52;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) = uVar54;
    (__return_storage_ptr__->lbounds).bounds1.upper.field_0 = local_1e18;
  }
  else {
    vSplitPos.field_0.v[0] = (longlong)&current.super_BuildRecord.prims;
    vSplitPos.field_0.v[1] = uVar42 + 0x58;
    local_1b28 = _DAT_01f7a9f0;
    local_1b18 = _DAT_01f7aa00;
    local_1b08 = _DAT_01f7a9f0;
    local_1af8 = _DAT_01f7aa00;
    uVar46 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end -
             current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
    if (uVar46 < 0xc00) {
      aVar50 = _DAT_01f7a9f0;
      aVar51 = _DAT_01f7aa00;
      aVar53 = _DAT_01f7aa00;
      aVar55 = _DAT_01f7a9f0;
      if (current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin <
          current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end) {
        lVar33 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin * 0x50 + 0xc;
        do {
          right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
          _0_4_ = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower;
          right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
          _4_4_ = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
          pIVar10 = *(Instance **)
                     (*(long *)(*(long *)vSplitPos.field_0.v[1] + 0x1e8) +
                     (ulong)*(uint *)((long)&((current.super_BuildRecord.prims.prims)->items->
                                             lbounds).bounds0.lower.field_0 + lVar33) * 8);
          local_1e18 = aVar55;
          local_1e08 = aVar50;
          local_1de8 = aVar51;
          local_1dc8 = aVar53;
          Instance::nonlinearBounds
                    (&lbbox_1,pIVar10,(BBox1f *)&right,&(pIVar10->super_Geometry).time_range,
                     (pIVar10->super_Geometry).fnumTimeSegments);
          auVar13._8_4_ = lbbox_1.bounds0.lower.field_0.m128[2];
          auVar13._0_8_ = lbbox_1.bounds0.lower.field_0._0_8_;
          auVar13._12_2_ = lbbox_1.bounds0.lower.field_0._12_2_;
          auVar13._14_2_ = lbbox_1.bounds0.lower.field_0._14_2_;
          aVar55.m128 = (__m128)minps(local_1e18.m128,auVar13);
          auVar14._8_8_ = lbbox_1.bounds0.upper.field_0._8_8_;
          auVar14._0_8_ = lbbox_1.bounds0.upper.field_0._0_8_;
          aVar53.m128 = (__m128)maxps(local_1dc8.m128,auVar14);
          auVar15._8_8_ = lbbox_1.bounds1.lower.field_0._8_8_;
          auVar15._0_8_ = lbbox_1.bounds1.lower.field_0._0_8_;
          aVar50.m128 = (__m128)minps(local_1e08.m128,auVar15);
          auVar16._8_8_ = lbbox_1.bounds1.upper.field_0._8_8_;
          auVar16._0_8_ = lbbox_1.bounds1.upper.field_0._0_8_;
          aVar51.m128 = (__m128)maxps(local_1de8.m128,auVar16);
          lVar33 = lVar33 + 0x50;
          uVar46 = uVar46 - 1;
        } while (uVar46 != 0);
      }
    }
    else {
      lbbox_1.bounds0.lower.field_0._12_2_ = 0x401;
      lbbox_1.bounds1.lower.field_0._0_8_ = 0;
      lbbox_1.bounds1.lower.field_0._8_8_ = 0;
      tbb::detail::r1::initialize((task_group_context *)&lbbox_1);
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           uVar23;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           uVar22;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0x400;
      isLeft.split = (Split *)&vSplitMask;
      isLeft.vSplitPos = &vSplitPos;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::Instance>>(embree::sse2::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::Instance>>(embree::sse2::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::Instance>>(embree::sse2::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::Instance>>(embree::sse2::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::Instance>>(embree::sse2::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)&left,(d1 *)&right,
                 (blocked_range<unsigned_long> *)&local_1b28.field_1,
                 (LBBox<embree::Vec3fa> *)&isLeft,
                 (anon_class_16_2_ed117de8_conflict31 *)isLeft.split,
                 (anon_class_1_0_00000001 *)&lbbox_1,in_stack_ffffffffffffe1d8);
      cVar27 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&lbbox_1);
      if (cVar27 != '\0') {
        prVar32 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar32,"task cancelled");
        __cxa_throw(prVar32,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)&lbbox_1);
      aVar55._8_8_ = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0._8_8_;
      aVar55._0_8_ = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0._0_8_;
      aVar53._8_8_ = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                     field_0._8_8_;
      aVar53._0_8_ = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                     field_0._0_8_;
      aVar50._8_8_ = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                     field_0._8_8_;
      aVar50._0_8_ = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                     field_0._0_8_;
      aVar51._8_8_ = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                     field_0._8_8_;
      aVar51._0_8_ = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                     field_0._0_8_;
    }
    (__return_storage_ptr__->ref).ptr = uVar47 | (ulong)pcVar39;
    (__return_storage_ptr__->lbounds).bounds0.lower.field_0 = aVar55;
    (__return_storage_ptr__->lbounds).bounds0.upper.field_0 = aVar53;
    (__return_storage_ptr__->lbounds).bounds1.lower.field_0 = aVar50;
    (__return_storage_ptr__->lbounds).bounds1.upper.field_0 = aVar51;
  }
  __return_storage_ptr__->dt = current.super_BuildRecord.prims.super_PrimInfoMB.time_range;
  if (local_848 == 0) {
    return __return_storage_ptr__;
  }
  uVar46 = 0;
  do {
    ppmVar11 = local_8c8[uVar46];
    ppmVar7 = ppmVar11 + 1;
    *ppmVar7 = (PrimRefVector)((long)&(*ppmVar7)[-1].items + 7);
    if (*ppmVar7 == (PrimRefVector)0x0) {
      pmVar34 = *ppmVar11;
      if (pmVar34 != (PrimRefVector)0x0) {
        sVar30 = pmVar34->size_alloced;
        pPVar29 = pmVar34->items;
        if (pPVar29 != (PrimRefMB *)0x0) {
          if (sVar30 * 0x50 < 0x1c00000) {
            alignedFree(pPVar29);
          }
          else {
            os_free(pPVar29,sVar30 * 0x50,(pmVar34->alloc).hugepages);
          }
        }
        if (sVar30 != 0) {
          pMVar12 = (pmVar34->alloc).device;
          (**pMVar12->_vptr_MemoryMonitorInterface)(pMVar12,sVar30 * -0x50,1);
        }
        pmVar34->size_active = 0;
        pmVar34->size_alloced = 0;
        pmVar34->items = (PrimRefMB *)0x0;
      }
      operator_delete(pmVar34);
    }
    uVar46 = uVar46 + 1;
  } while (uVar46 < local_848);
  return __return_storage_ptr__;
}

Assistant:

const NodeRecordMB4D createLargeLeaf(const BuildRecord& in, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (in.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* replace already found split by fallback split */
            const BuildRecordSplit current(BuildRecord(in.prims,in.depth),findFallback(in.prims));

            /* special case when directly creating leaf without any splits that could shrink time_range */
            bool force_split = false;
            if (current.depth == 1 && current.size() > 0)
            {
              BBox1f c = empty;
              BBox1f p = current.prims.time_range;
              for (size_t i=current.prims.begin(); i<current.prims.end(); i++) {
                mvector<PrimRefMB>& prims = *current.prims.prims;
                c.extend(prims[i].time_range);
              }
              
              force_split = c.lower > p.lower || c.upper < p.upper;
            }
	    
            /* create leaf for few primitives */
            if (current.size() <= cfg.maxLeafSize && current.split.data < Split::SPLIT_ENFORCE && !force_split)
              return createLeaf(current,alloc);
	  
            /* fill all children by always splitting the largest one */
            bool hasTimeSplits = false;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildListSplit children(current);

            do {
              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<children.size(); i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].size() <= cfg.maxLeafSize && children[i].split.data < Split::SPLIT_ENFORCE && !force_split)
                  continue;

                force_split = false;
                
                /* remember child with largest size */
                if (children[i].size() > bestSize) {
                  bestSize = children[i].size();
                  bestChild = i;
                }
              }
              if (bestChild == -1) break;

              /* perform best found split */
              BuildRecordSplit& brecord = children[bestChild];
              BuildRecordSplit lrecord(current.depth+1);
              BuildRecordSplit rrecord(current.depth+1);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(brecord.split,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;

              /* find new splits */
              lrecord.split = findFallback(lrecord.prims);
              rrecord.split = findFallback(rrecord.prims);
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));

            } while (children.size() < cfg.branchingFactor);

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = in.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* create node */
            auto node = createNode(children.children.data(),children.numChildren,alloc,hasTimeSplits);

            /* recurse into each child and perform reduction */
            LBBox3fa gbounds = empty;
            for (size_t i=0; i<children.size(); i++) {
              values[i] = createLargeLeaf(children[i],alloc);
              gbounds.extend(values[i].lbounds);
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (hasTimeSplits)
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }